

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall diligent_spirv_cross::ParsedIR::fixup_reserved_names(ParsedIR *this)

{
  uint uVar1;
  Variant *pVVar2;
  size_t sVar3;
  undefined8 in_RAX;
  SPIRVariable *pSVar4;
  mapped_type *name;
  long lVar5;
  Decoration *memb;
  Decoration *name_00;
  _Hash_node_base *p_Var6;
  undefined8 uStack_38;
  
  p_Var6 = (this->meta_needing_name_fixup)._M_h._M_before_begin._M_nxt;
  uStack_38 = in_RAX;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      uVar1 = *(uint *)&p_Var6[1]._M_nxt;
      pVVar2 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar2[uVar1].type == TypeVariable) {
        pSVar4 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar1);
        if (pSVar4->remapped_variable == false) goto LAB_007d82b3;
      }
      else {
LAB_007d82b3:
        uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
        name = ::std::__detail::
               _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->meta,(key_type *)((long)&uStack_38 + 4));
        sanitize_identifier((string *)name,false,false);
        sVar3 = (name->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size
        ;
        if (sVar3 != 0) {
          name_00 = (name->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
          lVar5 = sVar3 * 0x188;
          do {
            sanitize_identifier(&name_00->alias,true,false);
            name_00 = name_00 + 1;
            lVar5 = lVar5 + -0x188;
          } while (lVar5 != 0);
        }
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->meta_needing_name_fixup)._M_h);
  return;
}

Assistant:

void ParsedIR::fixup_reserved_names()
{
	for (uint32_t id : meta_needing_name_fixup)
	{
		// Don't rename remapped variables like 'gl_LastFragDepthARM'.
		if (ids[id].get_type() == TypeVariable && get<SPIRVariable>(id).remapped_variable)
			continue;

		auto &m = meta[id];
		sanitize_identifier(m.decoration.alias, false, false);
		for (auto &memb : m.members)
			sanitize_identifier(memb.alias, true, false);
	}
	meta_needing_name_fixup.clear();
}